

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcms_error.h
# Opt level: O0

void __thiscall cppcms::cppcms_error::~cppcms_error(cppcms_error *this)

{
  void *in_RDI;
  
  ~cppcms_error((cppcms_error *)0x116fd8);
  operator_delete(in_RDI);
  return;
}

Assistant:

class CPPCMS_API cppcms_error : public booster::runtime_error {
	std::string strerror(int err);
public:
	///
	/// Create an object with error code err (errno) and a message \a error
	///
	cppcms_error(int err,std::string const &error);
	///
	/// Create an object with message \a error
	///
	cppcms_error(std::string const &error) : booster::runtime_error(error) {};
}